

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O2

REF_STATUS ref_fixture_tri_surf_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int iVar7;
  REF_INT RVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  char *pcVar12;
  ulong uVar13;
  undefined8 uStack_c0;
  REF_INT cell;
  REF_INT local [27];
  
  uVar3 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar3 != 0) {
    uVar13 = (ulong)uVar3;
    pcVar12 = "create";
    uStack_c0 = 0x2f;
    goto LAB_00111702;
  }
  pRVar1 = *ref_grid_ptr;
  ref_node = pRVar1->node;
  pRVar1->surf = 1;
  iVar4 = ref_mpi->n;
  iVar5 = ref_mpi->id;
  iVar7 = 0;
  iVar10 = (int)(2 / (long)iVar4);
  iVar9 = iVar10 * iVar4;
  if (2 < iVar9) {
    iVar7 = ((((iVar4 + 2) / iVar4) * (iVar9 + -3)) / iVar10 - iVar9) + 3;
  }
  if (iVar5 == iVar7) {
LAB_00111242:
    uVar3 = ref_node_add(ref_node,0,local);
    if (uVar3 != 0) {
      uVar13 = (ulong)uVar3;
      pcVar12 = "add node";
      uStack_c0 = 0x3f;
      goto LAB_00111702;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[0];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[0] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(2 % (long)iVar4) + 1)) {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar8 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[0]) && (local[0] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar10 = (int)(2 / (long)iVar4);
      iVar4 = 3 - iVar4 * iVar10;
      RVar8 = iVar4 + (int)((lVar6 - iVar5 * iVar4) / (long)iVar10);
    }
    ref_node->part[lVar11] = RVar8;
    uVar3 = ref_node_add(ref_node,1,local + 1);
    if (uVar3 != 0) {
      uVar13 = (ulong)uVar3;
      pcVar12 = "add node";
      uStack_c0 = 0x40;
      goto LAB_00111702;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[1];
    pRVar2[lVar11 * 0xf] = 1.0;
    pRVar2 = pRVar2 + lVar11 * 0xf + 1;
    *pRVar2 = 0.0;
    pRVar2[1] = 0.0;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[1] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(2 % (long)iVar4) + 1)) {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar8 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[1]) && (local[1] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar10 = (int)(2 / (long)iVar4);
      iVar4 = 3 - iVar4 * iVar10;
      RVar8 = iVar4 + (int)((lVar6 - iVar5 * iVar4) / (long)iVar10);
    }
    ref_node->part[lVar11] = RVar8;
    uVar3 = ref_node_add(ref_node,2,local + 2);
    if (uVar3 != 0) {
      uVar13 = (ulong)uVar3;
      pcVar12 = "add node";
      uStack_c0 = 0x41;
      goto LAB_00111702;
    }
    pRVar2 = ref_node->real;
    lVar11 = (long)local[2];
    pRVar2[lVar11 * 0xf + 2] = 0.0;
    pRVar2 = pRVar2 + lVar11 * 0xf;
    *(undefined4 *)pRVar2 = 0;
    *(undefined4 *)((long)pRVar2 + 4) = 0;
    *(undefined4 *)(pRVar2 + 1) = 0;
    *(undefined4 *)((long)pRVar2 + 0xc) = 0x3ff00000;
    lVar6 = -1;
    if (((-1 < lVar11) && (local[2] < ref_node->max)) && (-1 < ref_node->global[lVar11])) {
      lVar6 = ref_node->global[lVar11];
    }
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    if (lVar6 / (long)iVar5 < (long)(ulong)((int)(2 % (long)iVar4) + 1)) {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      RVar8 = (REF_INT)(lVar6 / (long)iVar5);
    }
    else {
      lVar6 = -1;
      if ((-1 < local[2]) && (local[2] < ref_node->max)) {
        lVar6 = -1;
        if (-1 < ref_node->global[lVar11]) {
          lVar6 = ref_node->global[lVar11];
        }
      }
      iVar10 = (int)(2 / (long)iVar4);
      iVar4 = 3 - iVar4 * iVar10;
      RVar8 = iVar4 + (int)((lVar6 - iVar5 * iVar4) / (long)iVar10);
    }
    ref_node->part[lVar11] = RVar8;
    local[3] = 10;
    uVar3 = ref_cell_add(pRVar1->cell[3],local,&cell);
    if (uVar3 != 0) {
      uVar13 = (ulong)uVar3;
      pcVar12 = "add tri";
      uStack_c0 = 0x43;
      goto LAB_00111702;
    }
  }
  else {
    iVar4 = (iVar4 + 2) / iVar4;
    iVar7 = 0;
    if (iVar4 + 1U < 3) {
      iVar7 = iVar4;
    }
    iVar9 = 3 - iVar9;
    if (iVar9 <= iVar7) {
      iVar7 = (1 - iVar4 * iVar9) / iVar10 + iVar9;
    }
    if (iVar5 == iVar7) goto LAB_00111242;
    iVar7 = (int)(2 / (long)iVar4);
    if (iVar9 <= iVar7) {
      iVar7 = (2 - iVar4 * iVar9) / iVar10 + iVar9;
    }
    if (iVar5 == iVar7) goto LAB_00111242;
  }
  uVar3 = ref_node_initialize_n_global(ref_node,3);
  if (uVar3 == 0) {
    iVar4 = ref_mpi->n;
    iVar5 = (iVar4 + 2) / iVar4;
    iVar10 = 0;
    if (iVar5 + 1U < 3) {
      iVar10 = iVar5;
    }
    iVar7 = (int)(2 / (long)iVar4);
    iVar4 = 3 - iVar7 * iVar4;
    if (iVar4 <= iVar10) {
      iVar10 = (1 - iVar4 * iVar5) / iVar7 + iVar4;
    }
    if (ref_mpi->id != iVar10) {
      iVar10 = (int)(2 / (long)iVar5);
      if (iVar4 <= iVar10) {
        iVar10 = (2 - iVar5 * iVar4) / iVar7 + iVar4;
      }
      if (ref_mpi->id != iVar10) {
        return 0;
      }
    }
    uVar3 = ref_node_local(ref_node,1,local);
    if (uVar3 == 0) {
      uVar3 = ref_node_local(ref_node,2,local + 1);
      if (uVar3 == 0) {
        local[3] = 0x14;
        uVar3 = ref_cell_add(pRVar1->cell[0],local,&cell);
        if (uVar3 == 0) {
          return 0;
        }
        uVar13 = (ulong)uVar3;
        pcVar12 = "add edg";
        uStack_c0 = 0x52;
      }
      else {
        uVar13 = (ulong)uVar3;
        pcVar12 = "loc";
        uStack_c0 = 0x50;
      }
    }
    else {
      uVar13 = (ulong)uVar3;
      pcVar12 = "loc";
      uStack_c0 = 0x4f;
    }
  }
  else {
    uVar13 = (ulong)uVar3;
    pcVar12 = "init glob";
    uStack_c0 = 0x46;
  }
LAB_00111702:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
         uStack_c0,"ref_fixture_tri_surf_grid",uVar13,pcVar12);
  return (REF_STATUS)uVar13;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_tri_surf_grid(REF_GRID *ref_grid_ptr,
                                             REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT global[REF_CELL_MAX_SIZE_PER];
  REF_INT local[REF_CELL_MAX_SIZE_PER];
  REF_INT nnodesg = 3;
  REF_INT cell;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  ref_grid_surf(ref_grid) = REF_TRUE;

  global[0] = 0;
  global[1] = 1;
  global[2] = 2;
  global[3] = 10;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[2])) {
    add_that_node(0, 0.0, 0.0, 0.0);
    add_that_node(1, 1.0, 0.0, 0.0);
    add_that_node(2, 0.0, 1.0, 0.0);
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_tri(ref_grid), local, &cell), "add tri");
  }

  RSS(ref_node_initialize_n_global(ref_node, nnodesg), "init glob");

  global[0] = 1;
  global[1] = 2;
  global[3] = 20;
  if (ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[0]) ||
      ref_mpi_rank(ref_mpi) ==
          ref_part_implicit(nnodesg, ref_mpi_n(ref_mpi), global[1])) {
    RSS(ref_node_local(ref_node, global[0], &(local[0])), "loc");
    RSS(ref_node_local(ref_node, global[1], &(local[1])), "loc");
    local[3] = global[3];
    RSS(ref_cell_add(ref_grid_edg(ref_grid), local, &cell), "add edg");
  }

  return REF_SUCCESS;
}